

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O0

void PrintInventory(vector<Car,_std::allocator<Car>_> *cars)

{
  double dVar1;
  _Setprecision _Var2;
  size_type sVar3;
  ostream *poVar4;
  reference pvVar5;
  int local_14;
  int i;
  vector<Car,_std::allocator<Car>_> *cars_local;
  
  sVar3 = std::vector<Car,_std::allocator<Car>_>::size(cars);
  if (sVar3 == 0) {
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"No cars in inventory!");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Inventory printout:");
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_14 = 0;
    while( true ) {
      sVar3 = std::vector<Car,_std::allocator<Car>_>::size(cars);
      if (sVar3 <= (ulong)(long)local_14) break;
      poVar4 = std::operator<<((ostream *)&std::cout,"Car ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14 + 1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Make: ");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = std::operator<<(poVar4,(string *)pvVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Model: ");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = std::operator<<(poVar4,(string *)&pvVar5->model);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Year: ");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar5->year);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Purchase price: $");
      _Var2 = std::setprecision(2);
      poVar4 = std::operator<<(poVar4,_Var2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar5->purchasePrice);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Date purchased: ");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->datePurchased).month);
      poVar4 = std::operator<<(poVar4,"/");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->datePurchased).day);
      poVar4 = std::operator<<(poVar4,"/");
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->datePurchased).year);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
      if ((pvVar5->isSold & 1U) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Status: NOT SOLD");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Sale price: N/A");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Sale date: N/A");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Profit: N/A");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Status: SOLD");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Sale Price: $");
        _Var2 = std::setprecision(2);
        poVar4 = std::operator<<(poVar4,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar5->salePrice);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Date sold: ");
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->dateSold).month);
        poVar4 = std::operator<<(poVar4,"/");
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->dateSold).day);
        poVar4 = std::operator<<(poVar4,"/");
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pvVar5->dateSold).year);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Profit: $");
        _Var2 = std::setprecision(2);
        poVar4 = std::operator<<(poVar4,_Var2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        dVar1 = pvVar5->salePrice;
        pvVar5 = std::vector<Car,_std::allocator<Car>_>::at(cars,(long)local_14);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1 - pvVar5->purchasePrice);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void PrintInventory(vector<Car> &cars)
{

    if(cars.size() == 0)
    {
        cout << endl << "No cars in inventory!" << endl << endl;
        return;
    }

    cout << endl << endl;
    cout << "Inventory printout:";
    cout << endl << endl;

    for(int i = 0; i < cars.size(); i++)
    {
        cout << "Car " << (i + 1) << endl << endl;
        cout << "Make: " << cars.at(i).make << endl;
        cout << "Model: " << cars.at(i).model << endl;
        cout << "Year: " << cars.at(i).year << endl;
        cout << "Purchase price: $" << setprecision(2) << fixed << cars.at(i).purchasePrice << endl;
        cout << "Date purchased: " << cars.at(i).datePurchased.month << "/" << cars.at(i).datePurchased.day <<
                "/" << cars.at(i).datePurchased.year << endl;
        if(cars.at(i).isSold)
        {
            cout << "Status: SOLD" << endl;
            cout << "Sale Price: $" << setprecision(2) << fixed << cars.at(i).salePrice << endl;
            cout << "Date sold: " << cars.at(i).dateSold.month << "/" << cars.at(i).dateSold.day <<
                    "/" << cars.at(i).dateSold.year << endl;
            cout << "Profit: $" << setprecision(2) << fixed << (cars.at(i).salePrice - cars.at(i).purchasePrice) << endl;

        }
        else
        {
            cout << "Status: NOT SOLD" << endl;
            cout << "Sale price: N/A" << endl;
            cout << "Sale date: N/A" << endl;
            cout << "Profit: N/A" << endl;
        }

        cout << endl << endl;
    }
}